

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O0

pcp_errno pcp_db_add_flow(pcp_flow_t *f)

{
  pcp_ctx_s *ppVar1;
  uint32_t uVar2;
  pcp_ctx_t *ctx;
  pcp_flow_t **fdb;
  uint32_t indx;
  pcp_flow_t *f_local;
  
  if (f == (pcp_flow_t *)0x0) {
    f_local._4_4_ = PCP_ERR_BAD_ARGS;
  }
  else {
    ppVar1 = f->ctx;
    uVar2 = compute_flow_key(&f->kd);
    f->key_bucket = uVar2;
    for (ctx = (pcp_ctx_t *)((ppVar1->pcp_db).flows + uVar2); *(long *)ctx != 0;
        ctx = (pcp_ctx_t *)(*(long *)ctx + 0x90)) {
    }
    *(pcp_flow_t **)ctx = f;
    f->next = (pcp_flow_s *)0x0;
    (ppVar1->pcp_db).flow_cnt = (ppVar1->pcp_db).flow_cnt + 1;
    f_local._4_4_ = PCP_ERR_SUCCESS;
  }
  return f_local._4_4_;
}

Assistant:

pcp_errno pcp_db_add_flow(pcp_flow_t *f) {
    uint32_t indx;
    pcp_flow_t **fdb;
    pcp_ctx_t *ctx;

    if (!f) {
        return PCP_ERR_BAD_ARGS;
    }

    ctx = f->ctx;

    f->key_bucket = indx = compute_flow_key(&f->kd);
    PCP_LOG(PCP_LOGLVL_DEBUG, "Adding flow %p, key_bucket %d", f,
            f->key_bucket);

    for (fdb = ctx->pcp_db.flows + indx; (*fdb) != NULL; fdb = &(*fdb)->next)
        ;

    *fdb = f;
    f->next = NULL;
    ctx->pcp_db.flow_cnt++;

    PCP_LOG(PCP_LOGLVL_DEBUG, "total Number of flows added %zu",
            ctx->pcp_db.flow_cnt);

    return PCP_ERR_SUCCESS;
}